

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O3

int secp256k1_xonly_pubkey_cmp
              (secp256k1_context *ctx,secp256k1_xonly_pubkey *pk0,secp256k1_xonly_pubkey *pk1)

{
  byte *pbVar1;
  int iVar2;
  long lVar3;
  uchar *p1;
  bool bVar4;
  byte *pbVar5;
  bool bVar6;
  uchar out [2] [32];
  byte abStack_88 [24];
  undefined8 uStack_70;
  byte local_68 [32];
  byte local_48 [32];
  
  pbVar5 = local_68;
  bVar6 = true;
  do {
    bVar4 = bVar6;
    uStack_70 = 0x7a3927;
    iVar2 = secp256k1_xonly_pubkey_serialize(ctx,pbVar5,pk0);
    if (iVar2 == 0) {
      pbVar5[0x10] = 0;
      pbVar5[0x11] = 0;
      pbVar5[0x12] = 0;
      pbVar5[0x13] = 0;
      pbVar5[0x14] = 0;
      pbVar5[0x15] = 0;
      pbVar5[0x16] = 0;
      pbVar5[0x17] = 0;
      pbVar5[0x18] = 0;
      pbVar5[0x19] = 0;
      pbVar5[0x1a] = 0;
      pbVar5[0x1b] = 0;
      pbVar5[0x1c] = 0;
      pbVar5[0x1d] = 0;
      pbVar5[0x1e] = 0;
      pbVar5[0x1f] = 0;
      pbVar5[0] = 0;
      pbVar5[1] = 0;
      pbVar5[2] = 0;
      pbVar5[3] = 0;
      pbVar5[4] = 0;
      pbVar5[5] = 0;
      pbVar5[6] = 0;
      pbVar5[7] = 0;
      pbVar5[8] = 0;
      pbVar5[9] = 0;
      pbVar5[10] = 0;
      pbVar5[0xb] = 0;
      pbVar5[0xc] = 0;
      pbVar5[0xd] = 0;
      pbVar5[0xe] = 0;
      pbVar5[0xf] = 0;
    }
    pk0 = pk1;
    pbVar5 = local_48;
    bVar6 = false;
  } while (bVar4);
  lVar3 = 0x20;
  do {
    pbVar1 = abStack_88 + lVar3;
    pbVar5 = local_68 + lVar3;
    if (*pbVar1 != *pbVar5) break;
    bVar6 = lVar3 != 0x3f;
    lVar3 = lVar3 + 1;
  } while (bVar6);
  return (uint)*pbVar1 - (uint)*pbVar5;
}

Assistant:

int secp256k1_xonly_pubkey_cmp(const secp256k1_context* ctx, const secp256k1_xonly_pubkey* pk0, const secp256k1_xonly_pubkey* pk1) {
    unsigned char out[2][32];
    const secp256k1_xonly_pubkey* pk[2];
    int i;

    VERIFY_CHECK(ctx != NULL);
    pk[0] = pk0; pk[1] = pk1;
    for (i = 0; i < 2; i++) {
        /* If the public key is NULL or invalid, xonly_pubkey_serialize will
         * call the illegal_callback and return 0. In that case we will
         * serialize the key as all zeros which is less than any valid public
         * key. This results in consistent comparisons even if NULL or invalid
         * pubkeys are involved and prevents edge cases such as sorting
         * algorithms that use this function and do not terminate as a
         * result. */
        if (!secp256k1_xonly_pubkey_serialize(ctx, out[i], pk[i])) {
            /* Note that xonly_pubkey_serialize should already set the output to
             * zero in that case, but it's not guaranteed by the API, we can't
             * test it and writing a VERIFY_CHECK is more complex than
             * explicitly memsetting (again). */
            memset(out[i], 0, sizeof(out[i]));
        }
    }
    return secp256k1_memcmp_var(out[0], out[1], sizeof(out[1]));
}